

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::sendErrorToFederates(CommonCore *this,int errorCode,string_view message)

{
  ActionMessage errorCom;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> local_138;
  iterator local_118;
  iterator local_100;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  ActionMessage local_d8;
  
  local_e8._M_str = message._M_str;
  local_e8._M_len = message._M_len;
  ActionMessage::ActionMessage(&local_d8,cmd_local_error);
  local_d8.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  local_d8.messageID = errorCode;
  SmallBuffer::operator=(&local_d8.payload,&local_e8);
  gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::begin
            (&local_100,&(this->loopFederates).dataStorage);
  gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
            (&local_118,&(this->loopFederates).dataStorage);
  local_138.vec = local_100.vec;
  local_138.ptr = local_100.ptr;
  local_138.offset = local_100.offset;
  local_138._20_4_ = local_100._20_4_;
  while ((local_138.offset != local_118.offset || (local_138.vec != local_118.vec))) {
    if (((local_138.ptr)->fed != (FederateState *)0x0) && ((local_138.ptr)->state == OPERATING)) {
      FederateState::addAction((local_138.ptr)->fed,&local_d8);
    }
    gmlc::containers::BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**>::operator++(&local_138)
    ;
  }
  ActionMessage::~ActionMessage(&local_d8);
  return;
}

Assistant:

void CommonCore::sendErrorToFederates(int errorCode, std::string_view message)
{
    ActionMessage errorCom(CMD_LOCAL_ERROR);
    errorCom.source_id = global_broker_id_local;
    errorCom.messageID = errorCode;
    errorCom.payload = message;
    loopFederates.apply([&errorCom](auto& fed) {
        if ((fed) && (fed.state == OperatingState::OPERATING)) {
            fed->addAction(errorCom);
        }
    });
}